

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

void cf_sha512_digest_final(cf_sha512_context *ctx,uint8_t *hash)

{
  uint8_t *partial;
  size_t *npartial;
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  undefined8 local_38;
  
  npartial = &ctx->npartial;
  sVar2 = ctx->npartial;
  lVar1 = (ulong)ctx->blocks * 0x400 + sVar2 * 8;
  partial = ctx->partial;
  cf_blockwise_acc_pad
            (partial,npartial,0x80,0x80,'\0','\0',0x80 - (ulong)((int)sVar2 + 0x10U & 0x7f),
             sha512_update_block,ctx);
  local_38 = 0;
  cf_blockwise_accumulate(partial,npartial,0x80,&local_38,8,sha512_update_block,ctx);
  local_38 = CONCAT17((char)sVar2 * '\b',
                      CONCAT16((char)((ulong)lVar1 >> 8),
                               CONCAT15((char)((ulong)lVar1 >> 0x10),
                                        CONCAT14((char)((ulong)lVar1 >> 0x18),
                                                 CONCAT13((char)((ulong)lVar1 >> 0x20),
                                                          CONCAT12((char)((ulong)lVar1 >> 0x28),
                                                                   CONCAT11((char)((ulong)lVar1 >>
                                                                                  0x30),
                                                                            (char)((ulong)lVar1 >>
                                                                                  0x38))))))));
  cf_blockwise_accumulate(partial,npartial,0x80,&local_38,8,sha512_update_block,ctx);
  if (ctx->npartial == 0) {
    uVar3 = ctx->H[0];
    *(ulong *)hash =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar3 = ctx->H[1];
    *(ulong *)(hash + 8) =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar3 = ctx->H[2];
    *(ulong *)(hash + 0x10) =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar3 = ctx->H[3];
    *(ulong *)(hash + 0x18) =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar3 = ctx->H[4];
    *(ulong *)(hash + 0x20) =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar3 = ctx->H[5];
    *(ulong *)(hash + 0x28) =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar3 = ctx->H[6];
    *(ulong *)(hash + 0x30) =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar3 = ctx->H[7];
    *(ulong *)(hash + 0x38) =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    memset(ctx,0,0xd0);
    return;
  }
  abort();
}

Assistant:

void cf_sha512_digest_final(cf_sha512_context *ctx, uint8_t hash[CF_SHA512_HASHSZ])
{
  uint64_t digested_bytes = ctx->blocks;
  digested_bytes = digested_bytes * CF_SHA512_BLOCKSZ + ctx->npartial;
  uint64_t digested_bits = digested_bytes * 8;

  size_t padbytes = CF_SHA512_BLOCKSZ - ((digested_bytes + 16) % CF_SHA512_BLOCKSZ);

  /* Hash 0x80 00 ... block first. */
  cf_blockwise_acc_pad(ctx->partial, &ctx->npartial, sizeof ctx->partial,
                       0x80, 0x00, 0x00, padbytes,
                       sha512_update_block, ctx);

  /* Now hash length (this is 128 bits long). */
  uint8_t buf[8];
  write64_be(0, buf);
  cf_sha512_update(ctx, buf, 8);
  write64_be(digested_bits, buf);
  cf_sha512_update(ctx, buf, 8);

  /* We ought to have got our padding calculation right! */
  assert(ctx->npartial == 0);

  write64_be(ctx->H[0], hash + 0);
  write64_be(ctx->H[1], hash + 8);
  write64_be(ctx->H[2], hash + 16);
  write64_be(ctx->H[3], hash + 24);
  write64_be(ctx->H[4], hash + 32);
  write64_be(ctx->H[5], hash + 40);
  write64_be(ctx->H[6], hash + 48);
  write64_be(ctx->H[7], hash + 56);
  memset(ctx, 0, sizeof *ctx);
}